

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Index.cpp
# Opt level: O3

void __thiscall Indexing::Index::attachContainer(Index *this,ClauseContainer *cc)

{
  SubscriptionObject *pSVar1;
  void **head;
  undefined8 *puVar2;
  SmartPtr<Lib::SubscriptionObject> local_38;
  
  puVar2 = (undefined8 *)::operator_new(0x28);
  *puVar2 = 0;
  puVar2[1] = 0;
  *puVar2 = &PTR__HandlerStruct_00b29908;
  puVar2[2] = this;
  puVar2[3] = onAddedToContainer;
  puVar2[4] = 0;
  Lib::BaseEvent::subscribe((BaseEvent *)&local_38,(HandlerStruct *)&cc->addedEvent);
  Lib::SmartPtr<Lib::SubscriptionObject>::operator=(&this->_addedSD,&local_38);
  pSVar1 = local_38._obj;
  if (((local_38._obj != (SubscriptionObject *)0x0) && (local_38._refCnt != (RefCounter *)0x0)) &&
     ((local_38._refCnt)->_val = (local_38._refCnt)->_val + -1, (local_38._refCnt)->_val == 0)) {
    Lib::SubscriptionObject::~SubscriptionObject(local_38._obj);
    operator_delete(pSVar1,0x10);
    if (local_38._refCnt != (RefCounter *)0x0) {
      *(undefined8 *)local_38._refCnt = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_38._refCnt;
    }
  }
  puVar2 = (undefined8 *)::operator_new(0x28);
  *puVar2 = 0;
  puVar2[1] = 0;
  *puVar2 = &PTR__HandlerStruct_00b29908;
  puVar2[2] = this;
  puVar2[3] = onRemovedFromContainer;
  puVar2[4] = 0;
  Lib::BaseEvent::subscribe((BaseEvent *)&local_38,(HandlerStruct *)&cc->removedEvent);
  Lib::SmartPtr<Lib::SubscriptionObject>::operator=(&this->_removedSD,&local_38);
  if (((local_38._obj != (SubscriptionObject *)0x0) && (local_38._refCnt != (RefCounter *)0x0)) &&
     ((local_38._refCnt)->_val = (local_38._refCnt)->_val + -1, (local_38._refCnt)->_val == 0)) {
    Lib::SubscriptionObject::~SubscriptionObject(local_38._obj);
    operator_delete(local_38._obj,0x10);
    if (local_38._refCnt != (RefCounter *)0x0) {
      *(undefined8 *)local_38._refCnt = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_38._refCnt;
    }
  }
  return;
}

Assistant:

void Index::attachContainer(ClauseContainer* cc)
{
  ASS(_addedSD.isEmpty()); //only one container can be attached

  _addedSD = cc->addedEvent.subscribe(this,&Index::onAddedToContainer);
  _removedSD = cc->removedEvent.subscribe(this,&Index::onRemovedFromContainer);
}